

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  bool bVar1;
  char cVar2;
  _Rb_tree_node_base *p_Var3;
  string *psVar4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  double addCost;
  ostringstream errorMsg;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *costValue = 0.0;
  p_Var3 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var6) {
    do {
      bVar1 = TimeRange::isInRange((TimeRange *)&p_Var3[8]._M_left,time);
      if (bVar1) {
        cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x10))
                          (time,*(long **)(p_Var3 + 2),state,control,&local_1d0);
        if (cVar2 == '\0') {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
          psVar4 = Cost::name_abi_cxx11_(*(Cost **)(p_Var3 + 2));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,
                              psVar4->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("OptimalControlProblem","costsEvaluation",(char *)local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
        *costValue = (double)p_Var3[8]._M_parent * local_1d0 + *costValue;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::costsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            costValue = 0;
            double addCost;
            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if(!cost.second.cost->costEvaluation(time, state, control, addCost)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costsEvaluation", errorMsg.str().c_str());
                        return false;
                    }
                    costValue += cost.second.weight*addCost;
                }
            }

            return true;
        }